

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O0

ostream * __thiscall cali::Variant::write_cali(Variant *this,ostream *os)

{
  ostream *os_00;
  size_t size;
  char *pcVar1;
  string local_40;
  cali_attr_type local_1c;
  ostream *poStack_18;
  cali_attr_type type;
  ostream *os_local;
  Variant *this_local;
  
  poStack_18 = os;
  os_local = (ostream *)this;
  local_1c = Variant::type(this);
  os_00 = poStack_18;
  switch(local_1c) {
  case CALI_TYPE_INV:
    break;
  default:
    to_string_abi_cxx11_(&local_40,this);
    util::write_cali_esc_string(os_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    break;
  case CALI_TYPE_INT:
    std::ostream::operator<<(poStack_18,(this->m_v).value.v_int);
    break;
  case CALI_TYPE_UINT:
    util::write_uint64(poStack_18,(this->m_v).value.v_uint);
    break;
  case CALI_TYPE_STRING:
    pcVar1 = (char *)(this->m_v).value.unmanaged_ptr;
    size = Variant::size(this);
    util::write_cali_esc_string(os_00,pcVar1,size);
    break;
  case CALI_TYPE_DOUBLE:
    std::ostream::operator<<(poStack_18,(this->m_v).value.v_double);
    break;
  case CALI_TYPE_TYPE:
    pcVar1 = cali_type2string((this->m_v).value.v_type);
    std::operator<<(os_00,pcVar1);
  }
  return poStack_18;
}

Assistant:

std::ostream& Variant::write_cali(std::ostream& os)
{
    cali_attr_type type = this->type();

    switch (type) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_INT:
        os << m_v.value.v_int;
        break;
    case CALI_TYPE_DOUBLE:
        os << m_v.value.v_double;
        break;
    case CALI_TYPE_UINT:
        util::write_uint64(os, m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        util::write_cali_esc_string(os, static_cast<const char*>(m_v.value.unmanaged_const_ptr), size());
        break;
    case CALI_TYPE_TYPE:
        os << cali_type2string(m_v.value.v_type);
        break;
    default:
        util::write_cali_esc_string(os, to_string());
    }

    return os;
}